

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

void fill_dist_prices(lzma_lzma1_encoder *coder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint local_44;
  uint32_t dist_state_1;
  uint32_t price;
  uint32_t base;
  uint32_t footer_bits;
  uint32_t dist_slot_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t dist_slot_1;
  uint32_t dist_slot;
  uint32_t *dist_slot_prices;
  uint32_t dist_state;
  lzma_lzma1_encoder *coder_local;
  
  for (dist_slot_prices._4_4_ = 0; dist_slot_prices._4_4_ < 4;
      dist_slot_prices._4_4_ = dist_slot_prices._4_4_ + 1) {
    uVar4 = (ulong)dist_slot_prices._4_4_;
    for (i = 0; i < coder->dist_table_size; i = i + 1) {
      uVar1 = rc_bittree_price(coder->dist_slot[dist_slot_prices._4_4_],6,i);
      coder->dist_slot_prices[uVar4][i] = uVar1;
    }
    for (i_1 = 0xe; i_1 < coder->dist_table_size; i_1 = i_1 + 1) {
      uVar1 = rc_direct_price((i_1 >> 1) - 5);
      coder->dist_slot_prices[uVar4][i_1] = uVar1 + coder->dist_slot_prices[uVar4][i_1];
    }
    for (dist_slot_2 = 0; dist_slot_2 < 4; dist_slot_2 = dist_slot_2 + 1) {
      coder->dist_prices[dist_slot_prices._4_4_][dist_slot_2] =
           coder->dist_slot_prices[uVar4][dist_slot_2];
    }
  }
  for (footer_bits = 4; footer_bits < 0x80; footer_bits = footer_bits + 1) {
    uVar1 = get_dist_slot(footer_bits);
    uVar2 = (uVar1 >> 1) - 1;
    uVar3 = (uVar1 & 1 | 2) << ((byte)uVar2 & 0x1f);
    uVar2 = rc_bittree_reverse_price
                      ((probability *)((long)coder + (ulong)uVar1 * -2 + (ulong)uVar3 * 2 + 0x70fa),
                       uVar2,footer_bits - uVar3);
    for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
      coder->dist_prices[local_44][footer_bits] = uVar2 + coder->dist_slot_prices[local_44][uVar1];
    }
  }
  coder->match_price_count = 0;
  return;
}

Assistant:

static void
fill_dist_prices(lzma_lzma1_encoder *coder)
{
	for (uint32_t dist_state = 0; dist_state < DIST_STATES; ++dist_state) {

		uint32_t *const dist_slot_prices
				= coder->dist_slot_prices[dist_state];

		// Price to encode the dist_slot.
		for (uint32_t dist_slot = 0;
				dist_slot < coder->dist_table_size; ++dist_slot)
			dist_slot_prices[dist_slot] = rc_bittree_price(
					coder->dist_slot[dist_state],
					DIST_SLOT_BITS, dist_slot);

		// For matches with distance >= FULL_DISTANCES, add the price
		// of the direct bits part of the match distance. (Align bits
		// are handled by fill_align_prices()).
		for (uint32_t dist_slot = DIST_MODEL_END;
				dist_slot < coder->dist_table_size;
				++dist_slot)
			dist_slot_prices[dist_slot] += rc_direct_price(
					((dist_slot >> 1) - 1) - ALIGN_BITS);

		// Distances in the range [0, 3] are fully encoded with
		// dist_slot, so they are used for coder->dist_prices
		// as is.
		for (uint32_t i = 0; i < DIST_MODEL_START; ++i)
			coder->dist_prices[dist_state][i]
					= dist_slot_prices[i];
	}

	// Distances in the range [4, 127] depend on dist_slot and
	// dist_special. We do this in a loop separate from the above
	// loop to avoid redundant calls to get_dist_slot().
	for (uint32_t i = DIST_MODEL_START; i < FULL_DISTANCES; ++i) {
		const uint32_t dist_slot = get_dist_slot(i);
		const uint32_t footer_bits = ((dist_slot >> 1) - 1);
		const uint32_t base = (2 | (dist_slot & 1)) << footer_bits;
		const uint32_t price = rc_bittree_reverse_price(
				coder->dist_special + base - dist_slot - 1,
				footer_bits, i - base);

		for (uint32_t dist_state = 0; dist_state < DIST_STATES;
				++dist_state)
			coder->dist_prices[dist_state][i]
					= price + coder->dist_slot_prices[
						dist_state][dist_slot];
	}

	coder->match_price_count = 0;
	return;
}